

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

bool units::ReplaceStringInPlace
               (string *subject,char *search,int searchSize,char *replace,int replaceSize,
               size_t *firstReplacementIndex)

{
  size_t sVar1;
  size_type __pos;
  undefined4 in_register_00000084;
  bool bVar2;
  
  sVar1 = strlen(search);
  bVar2 = false;
  __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (subject,search,0,sVar1);
  if (__pos != 0xffffffffffffffff) {
    bVar2 = false;
    do {
      sVar1 = strlen(replace);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (subject,__pos,(ulong)(uint)searchSize,replace,sVar1);
      if (!bVar2) {
        *(size_type *)CONCAT44(in_register_00000084,replaceSize) = __pos;
        bVar2 = true;
      }
      sVar1 = strlen(search);
      __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (subject,search,__pos + 1,sVar1);
    } while (__pos != 0xffffffffffffffff);
  }
  return bVar2;
}

Assistant:

static bool ReplaceStringInPlace(
    std::string& subject,
    const char* search,
    int searchSize,
    const char* replace,
    int replaceSize,
    std::size_t& firstReplacementIndex)
{
    bool changed{false};
    std::size_t pos{0};
    while ((pos = subject.find(search, pos)) != std::string::npos) {
        subject.replace(pos, searchSize, replace);
        if (!changed) {
            changed = true;
            firstReplacementIndex = pos;
        }
        pos += replaceSize;
    }
    return changed;
}